

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_hishelf2_reinit(ma_hishelf2_config *pConfig,ma_hishelf2 *pFilter)

{
  long in_RSI;
  undefined4 *in_RDI;
  double dVar1;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  ma_result result;
  double sqrtA;
  double a;
  double S;
  double A;
  double c;
  double s;
  double w;
  ma_biquad_config *in_stack_fffffffffffffee8;
  undefined4 local_108;
  undefined4 local_104;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  undefined1 local_d0 [84];
  ma_result local_7c;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined4 *local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  double local_10;
  double local_8;
  
  if ((in_RSI == 0) || (in_RDI == (undefined4 *)0x0)) {
    local_7c = MA_INVALID_ARGS;
  }
  else {
    local_48 = (*(double *)(in_RDI + 8) * 6.283185307179586) / (double)(uint)in_RDI[2];
    local_40 = in_RDI;
    local_18 = local_48;
    local_50 = sin(local_48);
    local_10 = local_48;
    local_8 = 1.5707963267948966 - local_48;
    local_58 = sin(local_8);
    local_28 = *(double *)(local_40 + 4) / 40.0;
    local_20 = 0x4024000000000000;
    local_60 = pow(10.0,local_28);
    local_68 = *(double *)(local_40 + 6);
    dVar1 = local_50 / 2.0;
    local_30 = (local_60 + 1.0 / local_60) * (1.0 / local_68 - 1.0) + 2.0;
    local_70 = sqrt(local_30);
    local_70 = dVar1 * local_70;
    local_38 = local_60;
    dVar1 = sqrt(local_60);
    local_78 = dVar1 * 2.0 * local_70;
    local_100 = local_60 * ((local_60 - 1.0) * local_58 + local_60 + 1.0 + local_78);
    local_f8 = local_60 * -2.0 * ((local_60 + 1.0) * local_58 + (local_60 - 1.0));
    local_f0 = local_60 * (((local_60 - 1.0) * local_58 + local_60 + 1.0) - local_78);
    local_e8 = -(local_60 - 1.0) * local_58 + local_60 + 1.0 + local_78;
    local_e0 = (-(local_60 + 1.0) * local_58 + (local_60 - 1.0)) * 2.0;
    local_d8 = (-(local_60 - 1.0) * local_58 + local_60 + 1.0) - local_78;
    local_108 = *local_40;
    local_104 = local_40[1];
    memcpy(local_d0,&local_108,0x38);
    local_7c = ma_biquad_reinit(in_stack_fffffffffffffee8,(ma_biquad *)0x1c8019);
    if (local_7c == MA_SUCCESS) {
      local_7c = MA_SUCCESS;
    }
  }
  return local_7c;
}

Assistant:

MA_API ma_result ma_hishelf2_reinit(const ma_hishelf2_config* pConfig, ma_hishelf2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_hishelf2__get_biquad_config(pConfig);
    result = ma_biquad_reinit(&bqConfig, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}